

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  event_queue_impl_t *peVar1;
  _Map_pointer ppeVar2;
  stats_t evt_queue_stats;
  __atomic_base<unsigned_long> local_38;
  suffix_t local_30;
  
  local_30 = stats::suffixes::agent_count();
  local_38._M_i =
       (((this->m_dispatcher).m_ptr)->
       super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
       ).m_agents_bound.super___atomic_base<unsigned_long>._M_i;
  impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&this->m_base_prefix,&local_30,&local_38._M_i);
  peVar1 = (((this->m_dispatcher).m_ptr)->
           super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
           ).m_event_queue.m_ptr;
  ppeVar2 = (peVar1->m_demands).
            super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_30.m_value =
       (char *)(((long)(peVar1->m_demands).
                       super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(peVar1->m_demands).
                       super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
               ((long)(peVar1->m_demands).
                      super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(peVar1->m_demands).
                      super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555
               + (((long)ppeVar2 -
                   (long)(peVar1->m_demands).
                         super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(ppeVar2 == (_Map_pointer)0x0)) * 10);
  local_38._M_i = (__int_type)stats::suffixes::work_thread_queue_size();
  impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long_const&>
            (mbox,&this->m_base_prefix,(suffix_t *)&local_38,(unsigned_long *)&local_30);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								m_dispatcher.get().agents_bound() );

						const auto evt_queue_stats =
								m_dispatcher.get().event_queue().query_stats();
						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::work_thread_queue_size(),
								evt_queue_stats.m_demands_count );

						send_thread_activity_stats(
								mbox,
								m_base_prefix,
								m_dispatcher.get().thread_id(),
								m_dispatcher.get().activity_tracker() );
					}